

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

int sptk::world::anon_unknown_2::MergeF0Sub
              (double *f0_1,int f0_length,int st1,int ed1,double *f0_2,int st2,int ed2,
              double **f0_candidates,double **f0_scores,int number_of_candidates,double *merged_f0)

{
  int in_ECX;
  int in_EDX;
  long in_RDI;
  long in_R8;
  int in_R9D;
  double dVar1;
  int in_stack_00000008;
  int i_2;
  int i_1;
  int i;
  double score2;
  double score1;
  undefined4 in_stack_00000028;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined8 local_40;
  undefined8 local_38;
  undefined4 local_4;
  
  if ((in_R9D < in_EDX) || (local_4 = in_ECX, in_ECX < in_stack_00000008)) {
    local_38 = 0.0;
    local_40 = 0.0;
    for (local_44 = in_R9D; local_44 <= in_ECX; local_44 = local_44 + 1) {
      dVar1 = SearchScore(*(double *)(in_RDI + (long)local_44 * 8),
                          *(double **)(_i_1 + (long)local_44 * 8),
                          *(double **)((long)score2 + (long)local_44 * 8),score1._0_4_);
      local_38 = dVar1 + local_38;
      dVar1 = SearchScore(*(double *)(in_R8 + (long)local_44 * 8),
                          *(double **)(_i_1 + (long)local_44 * 8),
                          *(double **)((long)score2 + (long)local_44 * 8),score1._0_4_);
      local_40 = dVar1 + local_40;
    }
    local_4c = in_R9D;
    local_48 = in_ECX;
    if (local_38 <= local_40) {
      for (; local_4c <= in_stack_00000008; local_4c = local_4c + 1) {
        *(undefined8 *)(CONCAT44(st2,in_stack_00000028) + (long)local_4c * 8) =
             *(undefined8 *)(in_R8 + (long)local_4c * 8);
      }
    }
    else {
      for (; local_48 <= in_stack_00000008; local_48 = local_48 + 1) {
        *(undefined8 *)(CONCAT44(st2,in_stack_00000028) + (long)local_48 * 8) =
             *(undefined8 *)(in_R8 + (long)local_48 * 8);
      }
    }
    local_4 = in_stack_00000008;
  }
  return local_4;
}

Assistant:

static int MergeF0Sub(const double *f0_1, int f0_length, int st1, int ed1,
    const double *f0_2, int st2, int ed2, const double * const *f0_candidates,
    const double * const *f0_scores, int number_of_candidates,
    double *merged_f0) {
  if (st1 <= st2 && ed1 >= ed2) return ed1;

  double score1 = 0.0;
  double score2 = 0.0;
  for (int i = st2; i <= ed1; ++i) {
    score1 += SearchScore(f0_1[i], f0_candidates[i], f0_scores[i],
      number_of_candidates);
    score2 += SearchScore(f0_2[i], f0_candidates[i], f0_scores[i],
      number_of_candidates);
  }
  if (score1 > score2)
    for (int i = ed1; i <= ed2; ++i) merged_f0[i] = f0_2[i];
  else
    for (int i = st2; i <= ed2; ++i) merged_f0[i] = f0_2[i];

  return ed2;
}